

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  Op *pOVar4;
  long lVar5;
  long lVar6;
  sqlite3 *db;
  byte bVar7;
  long lVar8;
  long lVar9;
  Mem *pMVar10;
  void *pvVar11;
  VdbeCursor **ppVVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  Mem *pMVar16;
  Mem **ppMVar17;
  int iVar18;
  u64 uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  size_t sVar24;
  u64 uVar25;
  long lVar26;
  size_t __n;
  int iVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  int nArg;
  sqlite3 *local_40;
  long local_38;
  
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  local_40 = p->db;
  sVar2 = pParse->nVar;
  iVar3 = pParse->nTab;
  lVar26 = (long)iVar3;
  nArg = pParse->nMaxArg;
  iVar27 = pParse->nMem + iVar3;
  lVar8 = (long)(p->nOp * 0x18);
  pOVar4 = p->aOp;
  iVar18 = pParse->szOpAlloc;
  resolveP2Values(p,&nArg);
  if (pParse->isMultiWrite == '\0') {
    bVar13 = 0;
  }
  else {
    bVar13 = (pParse->mayAbort != '\0') << 5;
  }
  lVar20 = (long)sVar2;
  iVar27 = iVar27 + (uint)(0 < iVar27 && lVar26 == 0);
  uVar28 = iVar18 - lVar8 & 0xfffffffffffffff8;
  bVar1 = p->field_0xc6;
  bVar7 = bVar1 & 0xdf | bVar13;
  p->field_0xc6 = bVar7;
  if (pParse->explain != 0) {
    iVar18 = 10;
    if (10 < iVar27) {
      iVar18 = iVar27;
    }
    p->field_0xc6 = bVar1 & 0xd3 | bVar13 | (pParse->explain & 3) << 2;
    bVar31 = pParse->explain == '\x02';
    local_38 = lVar20;
    sqlite3VdbeSetNumCols(p,(uint)!bVar31 * 4 + 4);
    for (lVar20 = 0; ((ulong)(uint)bVar31 * 4 + 8) - (ulong)((uint)bVar31 * 8) != lVar20;
        lVar20 = lVar20 + 1) {
      sqlite3VdbeSetColName
                (p,(int)lVar20,0,
                 sqlite3VdbeMakeReady_azColName_rel +
                 *(int *)(sqlite3VdbeMakeReady_azColName_rel + (ulong)bVar31 * 0x20 + lVar20 * 4),
                 (_func_void_void_ptr *)0x0);
    }
    bVar7 = p->field_0xc6;
    lVar20 = local_38;
    iVar27 = iVar18;
  }
  db = local_40;
  p->field_0xc6 = bVar7 & 0xfc;
  lVar9 = (long)iVar27;
  lVar23 = lVar9 * 0x38;
  pMVar10 = (Mem *)0x0;
  uVar14 = uVar28 + lVar9 * -0x38;
  pMVar16 = (Mem *)((long)pOVar4 + uVar14 + lVar8);
  lVar5 = 0;
  if (SBORROW8(uVar28,lVar23) != (long)uVar14 < 0) {
    pMVar16 = pMVar10;
    lVar5 = lVar23;
    uVar14 = uVar28;
  }
  p->aMem = pMVar16;
  lVar22 = lVar20 * 0x38;
  uVar28 = uVar14 + lVar20 * -0x38;
  pMVar16 = (Mem *)((long)pOVar4 + uVar28 + lVar8);
  lVar6 = 0;
  if (SBORROW8(uVar14,lVar22) != (long)uVar28 < 0) {
    pMVar16 = pMVar10;
    lVar6 = lVar22;
    uVar28 = uVar14;
  }
  p->aVar = pMVar16;
  lVar29 = (long)nArg;
  lVar30 = lVar29 * 8;
  uVar14 = uVar28 + lVar29 * -8;
  lVar21 = 0;
  if ((long)uVar28 < lVar30) {
    lVar21 = lVar30;
  }
  pMVar16 = (Mem *)((long)pOVar4 + uVar14 + lVar8);
  if (SBORROW8(uVar28,lVar30) != (long)uVar14 < 0) {
    pMVar16 = pMVar10;
    uVar14 = uVar28;
  }
  p->apArg = (Mem **)pMVar16;
  __n = lVar26 * 8;
  lVar15 = uVar14 + lVar26 * -8;
  sVar24 = 0;
  if ((long)uVar14 < (long)__n) {
    sVar24 = __n;
  }
  pMVar16 = (Mem *)((long)pOVar4 + lVar15 + lVar8);
  if (SBORROW8(uVar14,__n) != lVar15 < 0) {
    pMVar16 = pMVar10;
  }
  p->apCsr = (VdbeCursor **)pMVar16;
  uVar25 = sVar24 + lVar21 + lVar6 + lVar5;
  if (uVar25 == 0) {
    if (local_40->mallocFailed != '\0') goto LAB_0011cb87;
  }
  else {
    pvVar11 = sqlite3DbMallocRawNN(local_40,uVar25);
    p->pFree = pvVar11;
    if (db->mallocFailed != '\0') {
LAB_0011cb87:
      p->nVar = 0;
      p->nMem = 0;
      p->nCursor = 0;
      goto LAB_0011cc5c;
    }
    pMVar16 = p->aMem;
    if (pMVar16 == (Mem *)0x0) {
      uVar19 = uVar25 + lVar9 * -0x38;
      if ((long)uVar25 < lVar23) {
        pMVar16 = (Mem *)0x0;
      }
      else {
        pMVar16 = (Mem *)((long)pvVar11 + uVar19);
        uVar25 = uVar19;
      }
    }
    p->aMem = pMVar16;
    pMVar16 = p->aVar;
    uVar19 = uVar25;
    if (pMVar16 == (Mem *)0x0) {
      uVar19 = uVar25 + lVar20 * -0x38;
      if ((long)uVar25 < lVar22) {
        pMVar16 = (Mem *)0x0;
        uVar19 = uVar25;
      }
      else {
        pMVar16 = (Mem *)((long)pvVar11 + uVar19);
      }
    }
    p->aVar = pMVar16;
    ppMVar17 = p->apArg;
    uVar25 = uVar19;
    if (ppMVar17 == (Mem **)0x0) {
      uVar25 = uVar19 + lVar29 * -8;
      if ((long)uVar19 < lVar30) {
        ppMVar17 = (Mem **)0x0;
        uVar25 = uVar19;
      }
      else {
        ppMVar17 = (Mem **)((long)pvVar11 + uVar25);
      }
    }
    p->apArg = ppMVar17;
    ppVVar12 = p->apCsr;
    if (ppVVar12 == (VdbeCursor **)0x0) {
      if ((long)uVar25 < (long)__n) {
        ppVVar12 = (VdbeCursor **)0x0;
      }
      else {
        ppVVar12 = (VdbeCursor **)((long)pvVar11 + uVar25 + lVar26 * -8);
      }
    }
    p->apCsr = ppVVar12;
  }
  p->nCursor = iVar3;
  p->nVar = sVar2;
  initMemArray(p->aVar,(int)sVar2,db,1);
  p->nMem = iVar27;
  initMemArray(p->aMem,iVar27,db,0);
  memset(p->apCsr,0,__n);
LAB_0011cc5c:
  sqlite3VdbeRewind(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    static const char * const azColName[] = {
       "addr", "opcode", "p1", "p2", "p3", "p4", "p5", "comment",
       "id", "parent", "notused", "detail"
    };
    int iFirst, mx, i;
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    if( pParse->explain==2 ){
      sqlite3VdbeSetNumCols(p, 4);
      iFirst = 8;
      mx = 12;
    }else{
      sqlite3VdbeSetNumCols(p, 8);
      iFirst = 0;
      mx = 8;
    }
    for(i=iFirst; i<mx; i++){
      sqlite3VdbeSetColName(p, i-iFirst, COLNAME_NAME,
                            azColName[i], SQLITE_STATIC);
    }
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  p->anExec = allocSpace(&x, 0, p->nOp*sizeof(i64));
#endif
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
      p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}